

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeResume<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  HeapTypeT *this;
  HeapType type_00;
  vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
  *resumetable_00;
  bool bVar1;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  _val_1;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  resumetable;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
       + 0x20);
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             __return_storage_ptr___00,ctx);
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_78,(Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                       *)__return_storage_ptr___00);
  local_90 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
             getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                     *)local_78);
  bVar1 = local_90 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_78);
  if (bVar1) {
    makeResumeTable<wasm::WATParser::ParseDefsCtx>
              ((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                *)((long)&_val_1.val.
                          super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  + 0x20),ctx);
    Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
    ::Result((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
              *)&err_1,
             (Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
              *)((long)&_val_1.val.
                        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                + 0x20));
    local_110 = Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                ::getErr((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                          *)&err_1);
    bVar1 = local_110 == (Err *)0x0;
    if (!bVar1) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
    ::~Result((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
               *)&err_1);
    if (bVar1) {
      this = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
             operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                        *)((long)&_val.val.
                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                          + 0x20));
      type_00 = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)this);
      resumetable_00 =
           Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
           ::operator*((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                        *)((long)&_val_1.val.
                                  super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                          + 0x20));
      ParseDefsCtx::makeResume(__return_storage_ptr__,ctx,pos,annotations,type_00,resumetable_00);
    }
    Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
    ::~Result((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
               *)((long)&_val_1.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 + 0x20));
  }
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             ((long)&_val.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeResume(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);

  auto resumetable = makeResumeTable(ctx);
  CHECK_ERR(resumetable);

  return ctx.makeResume(pos, annotations, *type, *resumetable);
}